

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CalcTangentsProcess.cpp
# Opt level: O3

void __thiscall
Assimp::CalcTangentsProcess::SetupProperties(CalcTangentsProcess *this,Importer *pImp)

{
  uint uVar1;
  ai_real aVar2;
  float fVar3;
  float fVar4;
  
  if (pImp != (Importer *)0x0) {
    aVar2 = Importer::GetPropertyFloat(pImp,"PP_CT_MAX_SMOOTHING_ANGLE",45.0);
    fVar4 = 45.0;
    if (aVar2 <= 45.0) {
      fVar4 = aVar2;
    }
    fVar3 = 0.0;
    if (0.0 <= fVar4) {
      fVar3 = fVar4;
    }
    this->configMaxAngle = fVar3 * 0.017453292;
    uVar1 = Importer::GetPropertyInteger(pImp,"PP_CT_TEXTURE_CHANNEL_INDEX",0);
    this->configSourceUV = uVar1;
    return;
  }
  __assert_fail("__null != pImp",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/PostProcessing/CalcTangentsProcess.cpp"
                ,0x52,"virtual void Assimp::CalcTangentsProcess::SetupProperties(const Importer *)")
  ;
}

Assistant:

void CalcTangentsProcess::SetupProperties(const Importer* pImp)
{
    ai_assert( NULL != pImp );

    // get the current value of the property
    configMaxAngle = pImp->GetPropertyFloat(AI_CONFIG_PP_CT_MAX_SMOOTHING_ANGLE,45.f);
    configMaxAngle = std::max(std::min(configMaxAngle,45.0f),0.0f);
    configMaxAngle = AI_DEG_TO_RAD(configMaxAngle);

    configSourceUV = pImp->GetPropertyInteger(AI_CONFIG_PP_CT_TEXTURE_CHANNEL_INDEX,0);
}